

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceObjectArchive::Merge(DeviceObjectArchive *this,DeviceObjectArchive *Src)

{
  char *pcVar1;
  int iVar2;
  pointer pSVar3;
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *pvVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  _Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
  _Var8;
  char *pcVar9;
  char (*Args_1) [14];
  uint *Idx;
  char *pcVar10;
  _Hash_node_base *p_Var11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range6;
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *pvVar12;
  ulong uVar13;
  char *in_R8;
  pointer pSVar14;
  long lVar15;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>,_bool>
  pVar16;
  Serializer<(Diligent::SerializerMode)0> Ser;
  Uint32 ShaderIndex;
  ShaderIndexArray ShaderIndices;
  char *ResName;
  DynamicLinearAllocator DynAllocator;
  string _msg;
  array<unsigned_int,_7UL> ShaderBaseIndices;
  char (*in_stack_fffffffffffffe08) [3];
  HashMapStringKey local_1f0;
  array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
  *local_1e0;
  DeviceObjectArchive *local_1d8;
  Serializer<(Diligent::SerializerMode)1> local_1d0;
  IMemoryAllocator *local_1b8;
  ConstQual<ShaderIndexArray> local_1b0;
  DeviceObjectArchive *local_1a0;
  _Hash_node_base *local_198;
  _Hash_node_base *local_190;
  DynamicLinearAllocator local_188;
  undefined1 local_158 [256];
  int local_58 [10];
  
  if (this->m_ContentVersion != Src->m_ContentVersion) {
    in_R8 = (char *)&Src->m_ContentVersion;
    FormatString<char[51],unsigned_int,char[6],unsigned_int,char[3]>
              ((string *)local_158,(Diligent *)"Merging archives with different content versions (",
               (char (*) [51])&this->m_ContentVersion,(uint *)0x7b9462,(char (*) [6])in_R8,
               (uint *)0x75ce90,in_stack_fffffffffffffe08);
    if (DebugMessageCallback != (undefined *)0x0) {
      in_R8 = (char *)0x0;
      (*(code *)DebugMessageCallback)(1,local_158._0_8_,0,0);
    }
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
  }
  local_1b8 = GetRawAllocator();
  local_188.m_Blocks.
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.m_Blocks.
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.m_Blocks.
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.m_BlockSize = 0x200;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_1e0 = &this->m_DeviceShaders;
  lVar15 = 0;
  local_1d8 = Src;
  local_1a0 = this;
  local_188.m_pAllocator = local_1b8;
  do {
    lVar7 = (long)local_1e0->_M_elems[lVar15].
                  super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1e0->_M_elems[lVar15].
                  super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    local_58[lVar15] = (int)lVar7;
    pSVar14 = (Src->m_DeviceShaders)._M_elems[lVar15].
              super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar3 = (Src->m_DeviceShaders)._M_elems[lVar15].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar14 != pSVar3) {
      pvVar4 = local_1e0->_M_elems;
      std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::reserve
                (pvVar4 + lVar15,((long)pSVar3 - (long)pSVar14 >> 5) + lVar7);
      pvVar12 = (Src->m_DeviceShaders)._M_elems + lVar15;
      pSVar3 = (pvVar12->
               super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pSVar14 = (pvVar12->
                     super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                     )._M_impl.super__Vector_impl_data._M_start; pSVar14 != pSVar3;
          pSVar14 = pSVar14 + 1) {
        SerializedData::MakeCopy((SerializedData *)local_158,pSVar14,local_1b8);
        std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
        emplace_back<Diligent::SerializedData>(pvVar4 + lVar15,(SerializedData *)local_158);
        SerializedData::~SerializedData((SerializedData *)local_158);
      }
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 7);
  p_Var11 = (local_1d8->m_NamedResources)._M_h._M_before_begin._M_nxt;
  if (p_Var11 != (_Hash_node_base *)0x0) {
    pcVar1 = local_158 + 0x10;
    do {
      local_1e0 = (array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
                   *)(ulong)*(uint *)&p_Var11[1]._M_nxt;
      local_190 = p_Var11[2]._M_nxt;
      HashMapStringKey::HashMapStringKey(&local_1f0,(Char *)local_190,true);
      local_198 = p_Var11;
      ResourceData::MakeCopy((ResourceData *)local_158,(ResourceData *)(p_Var11 + 4),local_1b8);
      pVar16 = std::
               _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::
               _M_emplace<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::DeviceObjectArchive::ResourceData>
                         ((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)local_1a0,&stack0xfffffffffffffe08,(ResourceData *)local_158);
      _Var8 = pVar16.first.
              super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
              ._M_cur;
      lVar15 = 0xe0;
      do {
        SerializedData::~SerializedData((SerializedData *)(local_158 + lVar15));
        lVar15 = lVar15 + -0x20;
      } while (lVar15 != 0);
      SerializedData::~SerializedData((SerializedData *)local_158);
      if ((local_1f0.Str != (char *)0x0) && ((long)local_1f0.Ownership_Hash < 0)) {
        operator_delete__(local_1f0.Str);
      }
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        bVar5 = ResourceData::operator==
                          ((ResourceData *)
                           ((long)_Var8.
                                  super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                  ._M_cur + 0x20),(ResourceData *)(p_Var11 + 4));
        if (!bVar5) {
          FormatString<char[26],char_const*,char[47]>
                    ((string *)local_158,(Diligent *)"Failed to copy resource \'",
                     (char (*) [26])&local_190,
                     (char **)"\': resource with the same name already exists.",(char (*) [47])in_R8
                    );
          if (DebugMessageCallback != (undefined *)0x0) {
            in_R8 = (char *)0x0;
            (*(code *)DebugMessageCallback)(1,local_158._0_8_,0,0);
          }
          if ((char *)local_158._0_8_ != pcVar1) {
            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
          }
        }
      }
      else {
        uVar6 = (int)local_1e0 - 3;
        local_1d8 = (DeviceObjectArchive *)CONCAT44(local_1d8._4_4_,uVar6);
        if ((uVar6 < 4) || ((int)local_1e0 == 1)) {
          lVar15 = 0;
          do {
            pcVar9 = *(char **)((long)_Var8.
                                      super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                      ._M_cur + 0x48 + lVar15 * 0x20);
            if (pcVar9 != (char *)0x0) {
              iVar2 = local_58[lVar15];
              lVar7 = lVar15 * 0x20 +
                      (long)_Var8.
                            super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                            ._M_cur + 0x40;
              if ((int)local_1e0 == 1) {
                local_1d0.m_Start = (TPointer)((ulong)local_1d0.m_Start & 0xffffffff00000000);
                local_1f0.Str = pcVar9 + *(long *)(lVar7 + 0x10);
                local_1f0.Ownership_Hash = (size_t)pcVar9;
                bVar5 = Serializer<(Diligent::SerializerMode)0>::Copy<unsigned_int>
                                  ((Serializer<(Diligent::SerializerMode)0> *)
                                   &stack0xfffffffffffffe08,(uint *)&local_1d0,4);
                if (!bVar5) {
                  in_R8 = 
                  "Failed to deserialize standalone shader index. Archive file may be corrupted or invalid."
                  ;
                  LogError<true,char[89]>
                            (false,"Merge",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                             ,0x271,(char (*) [89])
                                    "Failed to deserialize standalone shader index. Archive file may be corrupted or invalid."
                            );
                }
                if ((Char *)local_1f0.Ownership_Hash != local_1f0.Str) {
                  FormatString<char[51]>
                            ((string *)local_158,
                             (char (*) [51])"No other data besides the shader index is expected");
                  DebugAssertionFailed
                            ((Char *)local_158._0_8_,"Merge",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                             ,0x272);
                  if ((char *)local_158._0_8_ != pcVar1) {
                    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                  }
                }
                local_1d0.m_Start =
                     (TPointer)CONCAT44(local_1d0.m_Start._4_4_,(int)local_1d0.m_Start + iVar2);
                local_1f0.Ownership_Hash = *(undefined8 *)(lVar7 + 8);
                pcVar9 = (char *)(local_1f0.Ownership_Hash + *(long *)(lVar7 + 0x10));
                local_1f0.Str = pcVar9;
                Serializer<(Diligent::SerializerMode)1>::Copy<unsigned_int_const>
                          ((Serializer<(Diligent::SerializerMode)1> *)&stack0xfffffffffffffe08,
                           (uint *)&local_1d0,4);
                if ((Char *)local_1f0.Ownership_Hash != local_1f0.Str) {
                  FormatString<char[26],char[14]>
                            ((string *)local_158,(Diligent *)"Debug expression failed:\n",
                             (char (*) [26])0x75166c,(char (*) [14])pcVar9);
                  DebugAssertionFailed
                            ((Char *)local_158._0_8_,"Merge",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                             ,0x27a);
LAB_00493cac:
                  if ((char *)local_158._0_8_ != pcVar1) {
                    uVar13 = local_158._16_8_ + 1;
                    pcVar9 = (char *)local_158._0_8_;
                    goto LAB_00493cc4;
                  }
                }
              }
              else {
                if (3 < (uint)local_1d8) {
                  FormatString<char[25]>
                            ((string *)local_158,(char (*) [25])"Unexpected resource type");
                  DebugAssertionFailed
                            ((Char *)local_158._0_8_,"Merge",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                             ,0x294);
                  goto LAB_00493cac;
                }
                local_1b0.pIndices = (uint *)0x0;
                local_1b0.Count = 0;
                local_1f0.Str = pcVar9 + *(long *)(lVar7 + 0x10);
                local_1f0.Ownership_Hash = (size_t)pcVar9;
                bVar5 = PSOSerializer<(Diligent::SerializerMode)0>::SerializeShaderIndices
                                  ((Serializer<(Diligent::SerializerMode)0> *)
                                   &stack0xfffffffffffffe08,&local_1b0,&local_188);
                if (!bVar5) {
                  in_R8 = 
                  "Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid."
                  ;
                  LogError<true,char[84]>
                            (false,"Merge",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                             ,0x284,(char (*) [84])
                                    "Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid."
                            );
                }
                if ((Char *)local_1f0.Ownership_Hash != local_1f0.Str) {
                  FormatString<char[49]>
                            ((string *)local_158,
                             (char (*) [49])"No other data besides shader indices is expected");
                  DebugAssertionFailed
                            ((Char *)local_158._0_8_,"Merge",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                             ,0x285);
                  if ((char *)local_158._0_8_ != pcVar1) {
                    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                  }
                }
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                vector<unsigned_int_const*,void>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                           &stack0xfffffffffffffe08,local_1b0.pIndices,
                           local_1b0.pIndices + local_1b0.Count,(allocator_type *)local_158);
                for (pcVar10 = pcVar9; pcVar10 != local_1f0.Str; pcVar10 = pcVar10 + 4) {
                  *(int *)pcVar10 = *(int *)pcVar10 + iVar2;
                }
                Args_1 = *(char (**) [14])(lVar7 + 8);
                local_1d0.m_End = (TPointer)((long)*Args_1 + *(long *)(lVar7 + 0x10));
                local_158._8_4_ = local_1b0.Count;
                local_1d0.m_Start = (TPointer)Args_1;
                local_1d0.m_Ptr = (TPointer)Args_1;
                local_158._0_8_ = pcVar9;
                PSOSerializer<(Diligent::SerializerMode)1>::SerializeShaderIndices
                          (&local_1d0,(ConstQual<ShaderIndexArray> *)local_158,
                           (DynamicLinearAllocator *)0x0);
                if (local_1d0.m_Ptr != local_1d0.m_End) {
                  FormatString<char[26],char[14]>
                            ((string *)local_158,(Diligent *)"Debug expression failed:\n",
                             (char (*) [26])0x75166c,Args_1);
                  DebugAssertionFailed
                            ((Char *)local_158._0_8_,"Merge",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                             ,0x28f);
                  if ((char *)local_158._0_8_ != pcVar1) {
                    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                  }
                }
                if (pcVar9 == (char *)0x0) goto LAB_00493cc9;
                uVar13 = local_1f0.Ownership_Hash - (long)pcVar9;
LAB_00493cc4:
                operator_delete(pcVar9,uVar13);
              }
            }
LAB_00493cc9:
            lVar15 = lVar15 + 1;
          } while (lVar15 != 7);
        }
      }
      p_Var11 = local_198->_M_nxt;
    } while (p_Var11 != (_Hash_node_base *)0x0);
  }
  DynamicLinearAllocator::~DynamicLinearAllocator(&local_188);
  return;
}

Assistant:

void DeviceObjectArchive::Merge(const DeviceObjectArchive& Src) noexcept(false)
{
    if (m_ContentVersion != Src.m_ContentVersion)
        LOG_WARNING_MESSAGE("Merging archives with different content versions (", m_ContentVersion, " and ", Src.m_ContentVersion, ").");

    static_assert(static_cast<size_t>(ResourceType::Count) == 8, "Did you add a new resource type? You may need to handle it here.");

    auto&                  Allocator = GetRawAllocator();
    DynamicLinearAllocator DynAllocator{Allocator, 512};

    // Copy shaders
    std::array<Uint32, static_cast<size_t>(DeviceType::Count)> ShaderBaseIndices{};
    for (size_t i = 0; i < m_DeviceShaders.size(); ++i)
    {
        const auto& SrcShaders = Src.m_DeviceShaders[i];
        auto&       DstShaders = m_DeviceShaders[i];
        ShaderBaseIndices[i]   = static_cast<Uint32>(DstShaders.size());
        if (SrcShaders.empty())
            continue;
        DstShaders.reserve(DstShaders.size() + SrcShaders.size());
        for (const auto& SrcShader : SrcShaders)
            DstShaders.emplace_back(SrcShader.MakeCopy(Allocator));
    }

    // Copy named resources
    for (auto& src_res_it : Src.m_NamedResources)
    {
        const auto  ResType = src_res_it.first.GetType();
        const auto* ResName = src_res_it.first.GetName();

        auto it_inserted = m_NamedResources.emplace(NamedResourceKey{ResType, ResName, /*CopyName = */ true}, src_res_it.second.MakeCopy(Allocator));
        if (!it_inserted.second)
        {
            // Silently skip duplicate resources
            if (it_inserted.first->second != src_res_it.second)
                LOG_WARNING_MESSAGE("Failed to copy resource '", ResName, "': resource with the same name already exists.");

            continue;
        }

        const auto IsStandaloneShader = (ResType == ResourceType::StandaloneShader);
        const auto IsPipeline =
            (ResType == ResourceType::GraphicsPipeline ||
             ResType == ResourceType::ComputePipeline ||
             ResType == ResourceType::RayTracingPipeline ||
             ResType == ResourceType::TilePipeline);

        // Update shader indices
        if (IsStandaloneShader || IsPipeline)
        {
            for (size_t i = 0; i < static_cast<size_t>(DeviceType::Count); ++i)
            {
                const auto BaseIdx = ShaderBaseIndices[i];

                auto& DeviceData = it_inserted.first->second.DeviceSpecific[i];
                if (!DeviceData)
                    continue;

                if (IsStandaloneShader)
                {
                    // For shaders, device-specific data is the serialized shader bytecode index
                    Uint32 ShaderIndex = 0;
                    {
                        Serializer<SerializerMode::Read> Ser{DeviceData};
                        if (!Ser(ShaderIndex))
                            LOG_ERROR_AND_THROW("Failed to deserialize standalone shader index. Archive file may be corrupted or invalid.");
                        VERIFY(Ser.IsEnded(), "No other data besides the shader index is expected");
                    }

                    ShaderIndex += BaseIdx;

                    {
                        Serializer<SerializerMode::Write> Ser{DeviceData};
                        Ser(ShaderIndex);
                        VERIFY_EXPR(Ser.IsEnded());
                    }
                }
                else if (IsPipeline)
                {
                    // For pipelines, device-specific data is the shader index array
                    ShaderIndexArray ShaderIndices;
                    {
                        Serializer<SerializerMode::Read> Ser{DeviceData};
                        if (!PSOSerializer<SerializerMode::Read>::SerializeShaderIndices(Ser, ShaderIndices, &DynAllocator))
                            LOG_ERROR_AND_THROW("Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid.");
                        VERIFY(Ser.IsEnded(), "No other data besides shader indices is expected");
                    }

                    std::vector<Uint32> NewIndices{ShaderIndices.pIndices, ShaderIndices.pIndices + ShaderIndices.Count};
                    for (auto& Idx : NewIndices)
                        Idx += BaseIdx;

                    {
                        Serializer<SerializerMode::Write> Ser{DeviceData};
                        PSOSerializer<SerializerMode::Write>::SerializeShaderIndices(Ser, ShaderIndexArray{NewIndices.data(), ShaderIndices.Count}, nullptr);
                        VERIFY_EXPR(Ser.IsEnded());
                    }
                }
                else
                {
                    UNEXPECTED("Unexpected resource type");
                }
            }
        }
    }
}